

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall spv::Builder::makeBoolConstant(Builder *this,bool b,bool specConstant)

{
  pointer ppIVar1;
  Instruction *pIVar2;
  Id IVar3;
  Op OVar4;
  Id IVar5;
  undefined7 in_register_00000011;
  ulong uVar6;
  ulong uVar7;
  Op OVar8;
  undefined7 in_register_00000031;
  ulong uVar9;
  _Head_base<0UL,_spv::Instruction_*,_false> local_30;
  Instruction *c;
  
  IVar3 = makeBoolType(this);
  OVar8 = (Op)CONCAT71(in_register_00000031,b);
  OVar4 = OpConstantFalse - OVar8;
  OVar8 = OVar8 ^ OpSpecConstantFalse;
  if ((int)CONCAT71(in_register_00000011,specConstant) == 0) {
    ppIVar1 = this->groupedConstants[0x14].
              super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = (ulong)((long)this->groupedConstants[0x14].
                          super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar1) >> 3;
    uVar9 = 0;
    uVar7 = uVar6 & 0xffffffff;
    if ((int)uVar6 < 1) {
      uVar7 = uVar9;
    }
    IVar5 = 0;
    for (; uVar7 != uVar9; uVar9 = uVar9 + 1) {
      pIVar2 = ppIVar1[uVar9];
      if ((pIVar2->typeId == IVar3) && (pIVar2->opCode == OVar4)) {
        IVar5 = pIVar2->resultId;
      }
    }
    OVar8 = OVar4;
    if (IVar5 != 0) {
      return IVar5;
    }
  }
  local_30._M_head_impl = (Instruction *)dxil_spv::allocate_in_thread(0x38);
  IVar5 = this->uniqueId + 1;
  this->uniqueId = IVar5;
  (local_30._M_head_impl)->_vptr_Instruction = (_func_int **)&PTR__Instruction_001e31e0;
  (local_30._M_head_impl)->resultId = IVar5;
  (local_30._M_head_impl)->typeId = IVar3;
  (local_30._M_head_impl)->opCode = OVar8;
  ((local_30._M_head_impl)->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_30._M_head_impl)->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_30._M_head_impl)->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_30._M_head_impl)->block = (Block *)0x0;
  c = local_30._M_head_impl;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&this->constantsTypesGlobals,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_30);
  if (local_30._M_head_impl != (Instruction *)0x0) {
    (*(local_30._M_head_impl)->_vptr_Instruction[1])();
  }
  std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::push_back
            (this->groupedConstants + 0x14,&c);
  Module::mapInstruction(&this->module,c);
  return c->resultId;
}

Assistant:

Id Builder::makeBoolConstant(bool b, bool specConstant)
{
    Id typeId = makeBoolType();
    Instruction* constant;
    Op opcode = specConstant ? (b ? OpSpecConstantTrue : OpSpecConstantFalse) : (b ? OpConstantTrue : OpConstantFalse);

    // See if we already made it. Applies only to regular constants, because specialization constants
    // must remain distinct for the purpose of applying a SpecId decoration.
    if (! specConstant) {
        Id existing = 0;
        for (int i = 0; i < (int)groupedConstants[OpTypeBool].size(); ++i) {
            constant = groupedConstants[OpTypeBool][i];
            if (constant->getTypeId() == typeId && constant->getOpCode() == opcode)
                existing = constant->getResultId();
        }

        if (existing)
            return existing;
    }

    // Make it
    Instruction* c = new Instruction(getUniqueId(), typeId, opcode);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(c));
    groupedConstants[OpTypeBool].push_back(c);
    module.mapInstruction(c);

    return c->getResultId();
}